

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg.cpp
# Opt level: O1

MPP_RET mpp_sys_cfg_ioctl(MppSysCfg cfg)

{
  MPP_RET MVar1;
  
  if (cfg == (MppSysCfg)0x0) {
    _mpp_log_l(2,"mpp_sys_cfg","invalid NULL input config\n","mpp_sys_cfg_ioctl");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = MPP_OK;
    if (*(int *)((long)cfg + 0x10) != 0) {
      mpp_sys_dec_buf_chk_proc((MppSysDecBufChkCfg *)((long)cfg + 8));
      *(undefined4 *)((long)cfg + 0x10) = 0;
      MVar1 = MPP_OK;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_sys_cfg_ioctl(MppSysCfg cfg)
{
    MppSysCfgSet *p = (MppSysCfgSet *)cfg;

    if (!cfg) {
        mpp_err_f("invalid NULL input config\n");
        return MPP_ERR_NULL_PTR;
    }

    if (p->dec_buf_chk.enable) {
        mpp_sys_dec_buf_chk_proc(&p->dec_buf_chk);
        p->dec_buf_chk.enable = 0;
    }

    return MPP_OK;
}